

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void Commands::Uptime(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  double time;
  undefined8 uVar1;
  long lVar2;
  char *this;
  double current_time;
  string local_90 [32];
  string local_70;
  allocator<char> local_39;
  string local_38 [8];
  string buffer;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  buffer.field_2._8_8_ = from;
  std::allocator<char>::allocator();
  this = "Server started ";
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Server started ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  lVar2 = (**(code **)(*(long *)buffer.field_2._8_8_ + 0x20))();
  time = *(double *)(*(long *)(lVar2 + 0x80) + 0x98);
  current_time = Timer::GetTime();
  util::timeago_abi_cxx11_(&local_70,(util *)this,time,current_time);
  std::__cxx11::string::operator+=(local_38,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  uVar1 = buffer.field_2._8_8_;
  std::__cxx11::string::string(local_90,local_38);
  (**(code **)(*(long *)uVar1 + 0x28))(uVar1,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Uptime(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	std::string buffer = "Server started ";
	buffer += util::timeago(from->SourceWorld()->server->start, Timer::GetTime());
	from->ServerMsg(buffer);
}